

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall
QToolBarAreaLayout::getStyleOptionInfo
          (QToolBarAreaLayout *this,QStyleOptionToolBar *option,QToolBar *toolBar)

{
  QToolBarAreaLayoutLine *pQVar1;
  long lVar2;
  QToolBar *pQVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      return;
    }
    for (uVar7 = 0; uVar7 < (ulong)this->docks[lVar4].lines.d.size; uVar7 = uVar7 + 1) {
      pQVar1 = this->docks[lVar4].lines.d.ptr;
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < (ulong)pQVar1[uVar7].toolBarItems.d.size; uVar5 = uVar5 + 1) {
        pQVar3 = (QToolBar *)
                 (**(code **)(**(long **)((long)&(pQVar1[uVar7].toolBarItems.d.ptr)->widgetItem +
                                         lVar6) + 0x68))();
        if (pQVar3 == toolBar) {
          lVar2 = pQVar1[uVar7].toolBarItems.d.size;
          if (lVar2 == 1) {
            option->positionWithinLine = OnlyOne;
          }
          else if (lVar6 == 0) {
            option->positionWithinLine = Beginning;
          }
          else if (lVar2 - 1U == uVar5) {
            option->positionWithinLine = End;
          }
          else {
            option->positionWithinLine = Middle;
          }
          lVar4 = this->docks[lVar4].lines.d.size;
          if (lVar4 == 1) {
            option->positionOfLine = OnlyOne;
            return;
          }
          if (uVar7 == 0) {
            option->positionOfLine = Beginning;
            return;
          }
          if (lVar4 - 1U == uVar7) {
            option->positionOfLine = End;
            return;
          }
          option->positionOfLine = Middle;
          return;
        }
        lVar6 = lVar6 + 0x18;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void QToolBarAreaLayout::getStyleOptionInfo(QStyleOptionToolBar *option, QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar) {
                    if (line.toolBarItems.size() == 1)
                        option->positionWithinLine = QStyleOptionToolBar::OnlyOne;
                    else if (k == 0)
                        option->positionWithinLine = QStyleOptionToolBar::Beginning;
                    else if (k == line.toolBarItems.size() - 1)
                        option->positionWithinLine = QStyleOptionToolBar::End;
                    else
                        option->positionWithinLine = QStyleOptionToolBar::Middle;

                    if (dock.lines.size() == 1)
                        option->positionOfLine = QStyleOptionToolBar::OnlyOne;
                    else if (j == 0)
                        option->positionOfLine = QStyleOptionToolBar::Beginning;
                    else if (j == dock.lines.size() - 1)
                        option->positionOfLine = QStyleOptionToolBar::End;
                    else
                        option->positionOfLine = QStyleOptionToolBar::Middle;

                    return;
                }
            }
        }
    }
}